

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_future.cpp
# Opt level: O3

void __thiscall tst_future::finally(tst_future *this)

{
  QSharedData *pQVar1;
  QSharedData *pQVar2;
  QSharedData *pQVar3;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> *pQVar4;
  undefined8 uVar5;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> QVar6;
  PromiseResolver<int> PVar7;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar8;
  bool bVar9;
  char cVar10;
  PromiseData<int> *this_00;
  PromiseData<int> *this_01;
  char *pcVar11;
  char *pcVar12;
  PromiseDataBase<void,_void_()> *this_02;
  QPromiseReject<int> *in_R8;
  char *reject;
  QSharedData *pQVar13;
  PromiseResolver<void> resolver_2;
  _Any_data local_158;
  undefined **local_148;
  PromiseData<int> *pPStack_140;
  PromiseResolver<int> resolver_1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_120;
  QPromise<void> local_118;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_108;
  _Any_data local_100;
  _Manager_type local_f0;
  int value;
  PromiseResolver<int> resolver;
  Type input;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_50;
  code *local_40;
  
  local_158._0_4_ = 0x2a;
  QtPromise::resolve<int>((QtPromise *)&input,(int *)local_158._M_pod_data);
  QVar8 = input.super_QPromiseBase<int>.m_d;
  if (input.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar13 = &((input.super_QPromiseBase<int>.m_d.d)->
               super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this_00 = (PromiseData<int> *)operator_new(0x68);
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data = (exception_ptr)0x0;
  ((PromiseDataBase<QString,_void_(const_QString_&)> *)&this_00->m_value)->_vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> **)
   &((QVector<Catcher> *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr
    )->d = (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *
           )0x0;
  *(qsizetype *)
   &((QVector<Catcher> *)
    &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size)->d = 0;
  *(qsizetype *)
   &((QVector<Handler> *)
    &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size)->d = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = 0;
  *(pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> **)
   &((QVector<Handler> *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr
    )->d = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  *(undefined8 *)
   &((PromiseDataBase<QString,_void_(const_QString_&)> *)&this_00->m_value)->super_QSharedData = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_00130b58;
  QReadWriteLock::QReadWriteLock
            (&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock,0);
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = false;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = 0;
  *(pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> **)
   &((QVector<Handler> *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr
    )->d = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(qsizetype *)
   &((QVector<Handler> *)
    &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size)->d = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = 0;
  *(pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> **)
   &((QVector<Catcher> *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr
    )->d = (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *
           )0x0;
  *(qsizetype *)
   &((QVector<Catcher> *)
    &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size)->d = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data = (exception_ptr)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseData_00130af0;
  ((PromiseDataBase<QString,_void_(const_QString_&)> *)&this_00->m_value)->_vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)
   &((PromiseDataBase<QString,_void_(const_QString_&)> *)&this_00->m_value)->super_QSharedData = 0;
  LOCK();
  pQVar13 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  pQVar13->ref = (QAtomicInt)((int)pQVar13->ref + 1);
  UNLOCK();
  LOCK();
  pQVar13 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  pQVar13->ref = (QAtomicInt)((int)pQVar13->ref + 1);
  UNLOCK();
  pQVar13 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  local_100._M_unused._M_object = &PTR__QPromiseBase_00130ab8;
  local_100._8_8_ = this_00;
  QtPromisePrivate::PromiseResolver<QString>::PromiseResolver
            ((PromiseResolver<QString> *)&resolver,(QPromise<int> *)&local_100);
  local_100._M_unused._M_object = &PTR__QPromiseBase_001306c8;
  if ((PromiseData<int> *)local_100._8_8_ != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = (QSharedData *)(local_100._8_8_ + 8);
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseData<int> *)local_100._8_8_ != (PromiseData<int> *)0x0)) {
      (**(code **)(*(long *)local_100._8_8_ + 8))();
    }
  }
  PVar7.m_d.d = resolver.m_d.d;
  if (resolver.m_d.d == (Data *)0x0) {
    local_158._M_unused._M_object = (Data *)0x0;
LAB_0010ef96:
    local_158._8_8_ = (Data *)0x0;
    bVar9 = true;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    if (resolver.m_d.d == (Data *)0x0) {
      local_158._M_unused._M_object = (void *)resolver.m_d.d;
      LOCK();
      iRam0000000000000000 = iRam0000000000000000 + 1;
      UNLOCK();
      goto LAB_0010ef96;
    }
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    local_158._M_unused._M_object = (void *)resolver.m_d.d;
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    local_158._8_8_ = resolver.m_d.d;
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    bVar9 = false;
  }
  uVar5 = local_158._8_8_;
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_78._M_unused._M_object = operator_new(0x18);
  *(void **)local_78._M_unused._0_8_ = local_158._M_unused._M_object;
  if ((Data *)local_158._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_158._M_unused._0_8_ = *local_158._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = local_158._8_8_;
  if ((Data *)local_158._8_8_ == (Data *)0x0) {
    pcStack_60 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    *(int *)local_158._8_8_ = *(int *)local_158._8_8_ + 1;
    UNLOCK();
    pcStack_60 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_manager;
    if ((Data *)local_158._8_8_ != (Data *)0x0) {
      LOCK();
      *(int *)local_158._8_8_ = *(int *)local_158._8_8_ + -1;
      UNLOCK();
      if (*(int *)local_158._8_8_ == 0) {
        operator_delete((void *)local_158._8_8_,0x10);
      }
    }
  }
  if ((Data *)local_158._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_158._M_unused._0_8_ = *local_158._M_unused._M_object + -1;
    UNLOCK();
    if (*local_158._M_unused._M_object == 0) {
      operator_delete(local_158._M_unused._M_object,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (&(QVar8.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_int_&)> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  local_158._M_unused._M_object = (void *)PVar7.m_d.d;
  if (PVar7.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + 1;
    UNLOCK();
  }
  if (!bVar9) {
    LOCK();
    *(int *)uVar5 = *(int *)uVar5 + 1;
    UNLOCK();
  }
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_158._8_8_ = uVar5;
  local_98._M_unused._M_object = operator_new(0x18);
  *(void **)local_98._M_unused._0_8_ = local_158._M_unused._M_object;
  if ((Data *)local_158._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_158._M_unused._0_8_ = *local_158._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_98._M_unused._0_8_ + 8) = local_158._8_8_;
  if ((Data *)local_158._8_8_ == (Data *)0x0) {
    pcStack_80 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
                 ::_M_invoke;
    local_88 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    *(int *)local_158._8_8_ = *(int *)local_158._8_8_ + 1;
    UNLOCK();
    pcStack_80 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
                 ::_M_invoke;
    local_88 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_manager;
    if ((Data *)local_158._8_8_ != (Data *)0x0) {
      LOCK();
      *(int *)local_158._8_8_ = *(int *)local_158._8_8_ + -1;
      UNLOCK();
      if (*(int *)local_158._8_8_ == 0) {
        operator_delete((void *)local_158._8_8_,0x10);
      }
    }
  }
  if ((Data *)local_158._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_158._M_unused._0_8_ = *local_158._M_unused._M_object + -1;
    UNLOCK();
    if (*local_158._M_unused._M_object == 0) {
      operator_delete(local_158._M_unused._M_object,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (&(QVar8.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  if (!bVar9) {
    LOCK();
    *(int *)uVar5 = *(int *)uVar5 + -1;
    UNLOCK();
    if (*(int *)uVar5 == 0) {
      operator_delete((void *)uVar5,0x10);
    }
  }
  if (PVar7.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar7.m_d.d == 0) {
      operator_delete((void *)PVar7.m_d.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver.m_d.d == 0) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  bVar9 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(QVar8.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  if (!bVar9) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&(QVar8.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  }
  pQVar1 = &((QVar8.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  LOCK();
  pQVar2 = &((QVar8.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  this_01 = (PromiseData<int> *)operator_new(0x68);
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data = (exception_ptr)0x0;
  ((PromiseDataBase<int,_void_(const_int_&)> *)&this_01->m_value)->_vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> **)
   &((QVector<Catcher> *)&(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr
    )->d = (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *
           )0x0;
  *(qsizetype *)
   &((QVector<Catcher> *)
    &(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size)->d = 0;
  *(qsizetype *)
   &((QVector<Handler> *)
    &(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size)->d = 0;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = 0;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = 0;
  *(pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> **)
   &((QVector<Handler> *)&(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr
    )->d = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  *(undefined8 *)&((PromiseDataBase<int,_void_(const_int_&)> *)&this_01->m_value)->super_QSharedData
       = 0;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_001308a8;
  QReadWriteLock::QReadWriteLock
            (&(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock,0);
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = false;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = 0;
  *(pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> **)
   &((QVector<Handler> *)&(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr
    )->d = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(qsizetype *)
   &((QVector<Handler> *)
    &(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size)->d = 0;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = 0;
  *(pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> **)
   &((QVector<Catcher> *)&(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr
    )->d = (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *
           )0x0;
  *(qsizetype *)
   &((QVector<Catcher> *)
    &(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size)->d = 0;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data = (exception_ptr)0x0;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseData_00130840;
  ((PromiseDataBase<int,_void_(const_int_&)> *)&this_01->m_value)->_vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&((PromiseDataBase<int,_void_(const_int_&)> *)&this_01->m_value)->super_QSharedData
       = 0;
  LOCK();
  pQVar2 = &(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  pQVar2->ref = (QAtomicInt)((int)pQVar2->ref + 1);
  UNLOCK();
  LOCK();
  pQVar2 = &(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  pQVar2->ref = (QAtomicInt)((int)pQVar2->ref + 1);
  UNLOCK();
  pQVar2 = &(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  local_100._M_unused._M_object = &PTR__QPromiseBase_00130808;
  local_100._8_8_ = this_01;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver_1,(QPromise<int> *)&local_100);
  local_100._M_unused._M_object = &PTR__QPromiseBase_001305a0;
  if ((PromiseData<int> *)local_100._8_8_ != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar3 = (QSharedData *)(local_100._8_8_ + 8);
    (pQVar3->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar3->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar3->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseData<int> *)local_100._8_8_ != (PromiseData<int> *)0x0)) {
      (**(code **)(*(long *)local_100._8_8_ + 8))();
    }
  }
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_118.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)0x0;
    local_158._8_8_ = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_118.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)resolver_1.m_d.d;
    if (resolver_1.m_d.d == (Data *)0x0) {
      resolver_2.m_d.d =
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
LAB_0010f339:
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
      UNLOCK();
      local_158._8_8_ = resolver_2.m_d.d;
      if (resolver_2.m_d.d == (Data *)0x0) goto LAB_0010f34e;
    }
    else {
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
      UNLOCK();
      resolver_2.m_d.d =
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
           resolver_1.m_d.d;
      if (resolver_1.m_d.d != (Data *)0x0) goto LAB_0010f339;
    }
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
    UNLOCK();
    local_158._8_8_ = resolver_2.m_d.d;
  }
LAB_0010f34e:
  pPStack_140 = QVar8.d;
  LOCK();
  pQVar3 = &((QVar8.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar3->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar3->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_148 = &PTR__QPromiseBase_00130808;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  resolver_2.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)local_158._8_8_;
  local_158._M_unused._M_object = local_118.super_QPromiseBase<void>._vptr_QPromiseBase;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       operator_new(0x20);
  *(void **)resolver.m_d.d = local_158._M_unused._M_object;
  if ((Data *)local_158._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_158._M_unused._0_8_ = *local_158._M_unused._M_object + 1;
    UNLOCK();
  }
  ((Data *)resolver.m_d.d)->promise = (QPromise<int> *)local_158._8_8_;
  if ((Data *)local_158._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_158._8_8_ = *(int *)local_158._8_8_ + 1;
    UNLOCK();
  }
  *(undefined ***)((long)resolver.m_d.d + 0x10) = &PTR__QPromiseBase_001305a0;
  ((Data *)((long)resolver.m_d.d + 0x10))->promise = (QPromise<int> *)pPStack_140;
  if (pPStack_140 == (PromiseData<int> *)0x0) {
    *(undefined ***)((long)resolver.m_d.d + 0x10) = &PTR__QPromiseBase_00130808;
    local_148 = &PTR__QPromiseBase_001305a0;
  }
  else {
    LOCK();
    pQVar4 = (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> *)
             &(pPStack_140->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    *(int *)&pQVar4->d = *(int *)&pQVar4->d + 1;
    UNLOCK();
    *(undefined ***)((long)resolver.m_d.d + 0x10) = &PTR__QPromiseBase_00130808;
    local_148 = &PTR__QPromiseBase_001305a0;
    if (pPStack_140 != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar4 = (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> *)
               &(pPStack_140->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      *(int *)&pQVar4->d = *(int *)&pQVar4->d + -1;
      UNLOCK();
      if ((*(int *)&pQVar4->d == 0) && (pPStack_140 != (PromiseData<int> *)0x0)) {
        (*(pPStack_140->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])();
      }
    }
  }
  if ((Data *)local_158._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_158._8_8_ = *(int *)local_158._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_158._8_8_ == 0) {
      operator_delete((void *)local_158._8_8_,0x10);
    }
  }
  if ((Data *)local_158._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_158._M_unused._0_8_ = *local_158._M_unused._M_object + -1;
    UNLOCK();
    if (*local_158._M_unused._M_object == 0) {
      operator_delete(local_158._M_unused._M_object,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::addHandler
            ((PromiseDataBase<QString,_void_(const_QString_&)> *)this_00,
             (function<void_(const_QString_&)> *)&resolver);
  std::
  _Function_handler<void_(const_QString_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
  ::_M_manager((_Any_data *)&resolver,(_Any_data *)&resolver,__destroy_functor);
  QtPromisePrivate::PromiseCatcher<QString,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50,
             (PromiseCatcher<QString,decltype(nullptr),void> *)0x0,&local_118,
             (QPromiseResolve<int> *)&resolver_2,in_R8);
  QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::addCatcher
            ((PromiseDataBase<QString,_void_(const_QString_&)> *)this_00,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_2.m_d.d == 0) {
      operator_delete((void *)resolver_2.m_d.d,0x10);
    }
  }
  if ((Data *)local_118.super_QPromiseBase<void>._vptr_QPromiseBase != (Data *)0x0) {
    LOCK();
    (((QSharedData *)local_118.super_QPromiseBase<void>._vptr_QPromiseBase)->ref).
    super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i
         = (((QSharedData *)local_118.super_QPromiseBase<void>._vptr_QPromiseBase)->ref).
           super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QSharedData *)local_118.super_QPromiseBase<void>._vptr_QPromiseBase)->ref).
        super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
        _M_i == 0) {
      operator_delete(local_118.super_QPromiseBase<void>._vptr_QPromiseBase,0x10);
    }
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_1.m_d.d == 0) {
      operator_delete((void *)resolver_1.m_d.d,0x10);
    }
  }
  bVar9 = QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::isPending
                    ((PromiseDataBase<QString,_void_(const_QString_&)> *)this_00);
  if (!bVar9) {
    QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::dispatch
              ((PromiseDataBase<QString,_void_(const_QString_&)> *)this_00);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*((QVar8.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(QVar8.d)
    ;
  }
  LOCK();
  pQVar13->ref = (QAtomicInt)((int)pQVar13->ref + -1);
  UNLOCK();
  if (((QAtomicInteger<int>)pQVar13->ref).super_QAtomicInteger<int> == (QAtomicInteger<int>)0x0) {
    (*(this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(this_00);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*((QVar8.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(QVar8.d)
    ;
  }
  QVar8.d = input.super_QPromiseBase<int>.m_d.d;
  bVar9 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(input.super_QPromiseBase<int>.m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>);
  bVar9 = (bool)(~bVar9 & ((QVar8.d)->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data
                          ._M_exception_object == (void *)0x0);
  local_158._M_pod_data[0] = bVar9;
  local_100._M_pod_data[0] = '\x01';
  pcVar11 = QTest::toString<bool>((bool *)local_158._M_pod_data);
  pcVar12 = QTest::toString<bool>((bool *)local_100._M_pod_data);
  cVar10 = QTest::compare_helper
                     (bVar9,"Compared values are not the same",pcVar11,pcVar12,"input.isFulfilled()"
                      ,"true",
                      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                      ,0x148);
  if (cVar10 == '\0') goto LAB_0010fa39;
  bVar9 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    ((PromiseDataBase<int,_void_(const_int_&)> *)this_01);
  local_158._M_pod_data[0] = bVar9;
  local_100._M_pod_data[0] = '\x01';
  pcVar11 = QTest::toString<bool>((bool *)local_158._M_pod_data);
  pcVar12 = QTest::toString<bool>((bool *)local_100._M_pod_data);
  reject = "output.isPending()";
  cVar10 = QTest::compare_helper
                     (bVar9,"Compared values are not the same",pcVar11,pcVar12,"output.isPending()",
                      "true",
                      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                      ,0x149);
  if (cVar10 == '\0') goto LAB_0010fa39;
  value = -1;
  this_02 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  this_02->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_02->super_QSharedData = 0;
  (this_02->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_02->m_catchers).d.size = 0;
  (this_02->m_handlers).d.size = 0;
  (this_02->m_catchers).d.d = (Data *)0x0;
  (this_02->m_handlers).d.d = (Data *)0x0;
  (this_02->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&this_02->m_lock = 0;
  *(undefined8 *)&this_02->m_settled = 0;
  (this_02->m_error).m_data._M_exception_object = (void *)0x0;
  this_02->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_001307a8;
  QReadWriteLock::QReadWriteLock(&this_02->m_lock,0);
  this_02->m_settled = false;
  (this_02->m_handlers).d.d = (Data *)0x0;
  (this_02->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (this_02->m_handlers).d.size = 0;
  (this_02->m_catchers).d.d = (Data *)0x0;
  (this_02->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_02->m_catchers).d.size = 0;
  (this_02->m_error).m_data._M_exception_object = (void *)0x0;
  this_02->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00130730;
  LOCK();
  (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar13 = &this_02->super_QSharedData;
  local_118.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001306f8;
  local_118.super_QPromiseBase<void>.m_d.d = (PromiseData<void> *)this_02;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_2,&local_118);
  local_118.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00130570;
  if (&(local_118.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> !=
      (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar1 = &((local_118.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (&(local_118.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> !=
        (PromiseDataBase<void,_void_()> *)0x0)) {
      (*((local_118.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  if (resolver_2.m_d.d == (Data *)0x0) {
    local_108.d = (Data *)0x0;
    local_120.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
    UNLOCK();
    local_108.d = (Data *)resolver_2.m_d.d;
    if (resolver_2.m_d.d == (Data *)0x0) {
      local_120.d = (Data *)0x0;
LAB_0010f7a8:
      LOCK();
      *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
      UNLOCK();
      if (local_120.d == (Data *)0x0) goto LAB_0010f7bd;
    }
    else {
      LOCK();
      *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
      UNLOCK();
      local_120.d = (Data *)resolver_2.m_d.d;
      if (resolver_2.m_d.d != (Data *)0x0) goto LAB_0010f7a8;
    }
    LOCK();
    ((local_120.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_120.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
LAB_0010f7bd:
  QVar6.d = local_120.d;
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = (Data *)0x0;
  local_148 = (undefined **)0x0;
  pPStack_140 = (PromiseData<int> *)0x0;
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)local_108.d;
  local_158._M_unused._M_object = operator_new(0x18);
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
  local_158._M_unused._0_8_)->d = (Data *)resolver_1.m_d.d;
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
  ((long)local_158._M_unused._0_8_ + 8))->d = QVar6.d;
  if (QVar6.d == (Data *)0x0) {
    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
    ((long)local_158._M_unused._0_8_ + 0x10))->d = (Data *)&value;
    pPStack_140 = (PromiseData<int> *)
                  std::
                  _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                  ::_M_invoke;
    local_148 = (undefined **)
                std::
                _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                ::_M_manager;
  }
  else {
    LOCK();
    ((QVar6.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar6.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
    ((long)local_158._M_unused._0_8_ + 0x10))->d = (Data *)&value;
    pPStack_140 = (PromiseData<int> *)
                  std::
                  _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                  ::_M_invoke;
    local_148 = (undefined **)
                std::
                _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                ::_M_manager;
    if (QVar6.d != (Data *)0x0) {
      LOCK();
      ((QVar6.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           ((QVar6.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((QVar6.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(QVar6.d,0x10);
      }
    }
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_1.m_d.d == 0) {
      operator_delete((void *)resolver_1.m_d.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            ((PromiseDataBase<int,_void_(const_int_&)> *)this_01,
             (function<void_(const_int_&)> *)&local_158);
  if (local_148 != (undefined **)0x0) {
    (*(code *)local_148)(&local_158,&local_158,__destroy_functor);
  }
  QtPromisePrivate::PromiseCatcher<int,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_100,
             (PromiseCatcher<int,decltype(nullptr),void> *)0x0,&local_108,
             (QPromiseResolve<void> *)&local_120,(QPromiseReject<void> *)reject);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            ((PromiseDataBase<int,_void_(const_int_&)> *)this_01,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_100);
  if (local_f0 != (_Manager_type)0x0) {
    (*local_f0)(&local_100,&local_100,__destroy_functor);
  }
  if (local_120.d != (Data *)0x0) {
    LOCK();
    ((local_120.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          ((local_120.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)
        ((local_120.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) {
      operator_delete(local_120.d,0x10);
    }
  }
  if (local_108.d != (Data *)0x0) {
    LOCK();
    ((local_108.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_108.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_108.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_108.d,0x10);
    }
  }
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_2.m_d.d == 0) {
      operator_delete((void *)resolver_2.m_d.d,0x10);
    }
  }
  bVar9 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    ((PromiseDataBase<int,_void_(const_int_&)> *)this_01);
  if (!bVar9) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              ((PromiseDataBase<int,_void_(const_int_&)> *)this_01);
  }
  bVar9 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_02);
  while (bVar9 != false) {
    QCoreApplication::processEvents();
    QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
    bVar9 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_02);
  }
  LOCK();
  (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_02->_vptr_PromiseDataBase[1])(this_02);
  }
  LOCK();
  (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_02->_vptr_PromiseDataBase[1])(this_02);
  }
  bVar9 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    ((PromiseDataBase<int,_void_(const_int_&)> *)this_01);
  bVar9 = (bool)(~bVar9 & ((void *)(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_error
                                   .m_data)._M_exception_object == (void *)0x0);
  resolver_1.m_d.d._0_1_ = bVar9;
  local_118.super_QPromiseBase<void>._vptr_QPromiseBase =
       (_func_int **)CONCAT71(local_118.super_QPromiseBase<void>._vptr_QPromiseBase._1_7_,1);
  pcVar11 = QTest::toString<bool>((bool *)&resolver_1);
  pcVar12 = QTest::toString<bool>((bool *)&local_118);
  cVar10 = QTest::compare_helper
                     (bVar9,"Compared values are not the same",pcVar11,pcVar12,
                      "output.isFulfilled()","true",
                      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                      ,0x152);
  if (cVar10 != '\0') {
    QTest::qCompare(value,0x2a,"value","42",
                    "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                    ,0x153);
  }
LAB_0010fa39:
  LOCK();
  pQVar2->ref = (QAtomicInt)((int)pQVar2->ref + -1);
  UNLOCK();
  if (((QAtomicInteger<int>)pQVar2->ref).super_QAtomicInteger<int> == (QAtomicInteger<int>)0x0) {
    (*(this_01->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(this_01);
  }
  input.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001305a0;
  if (input.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar13 = &((input.super_QPromiseBase<int>.m_d.d)->
               super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (input.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((input.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_future::finally()
{
    auto input = QtPromise::resolve(42);
    auto output = input.finally([]() {
        return QtConcurrent::run([]() {
            return QString{"foo"};
        });
    });

    Q_STATIC_ASSERT((std::is_same<decltype(output), QtPromise::QPromise<int>>::value));

    QCOMPARE(input.isFulfilled(), true);
    QCOMPARE(output.isPending(), true);

    int value = -1;
    output
        .then([&](int res) {
            value = res;
        })
        .wait();

    QCOMPARE(output.isFulfilled(), true);
    QCOMPARE(value, 42);
}